

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Array.hpp
# Opt level: O3

void __thiscall Lib::Array<char>::~Array(Array<char> *this)

{
  ~Array(this);
  operator_delete(this,0x18);
  return;
}

Assistant:

virtual ~Array()
  {
    if(_array) {
      array_delete(_array, _capacity);
      DEALLOC_KNOWN(_array,_capacity*sizeof(C),"Array<>");
    }
  }